

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

float tcu::smoothStep(float edge0,float edge1,float x)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (edge0 < x) {
    if (edge1 <= x) {
      return 1.0;
    }
    fVar2 = (x - edge0) / (edge1 - edge0);
    fVar1 = 1.0;
    if (fVar2 <= 1.0) {
      fVar1 = fVar2;
    }
    fVar1 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
    fVar1 = (3.0 - (fVar1 + fVar1)) * fVar1 * fVar1;
  }
  return fVar1;
}

Assistant:

inline float smoothStep		(float edge0, float edge1, float x)
{
	if (x <= edge0) return 0.0f;
	if (x >= edge1) return 1.0f;
	float t = de::clamp((x - edge0) / (edge1 - edge0), 0.0f, 1.0f);
	return t * t * (3.0f - 2.0f * t);
}